

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_find(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_INT *found)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT RVar4;
  ulong uVar5;
  
  *found = -1;
  RVar4 = -1;
  uVar5 = 0xffffffff;
  if (-1 < node) {
    pRVar2 = ref_geom->ref_adj;
    uVar5 = 0xffffffff;
    RVar4 = -1;
    if (node < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node];
      uVar5 = 0xffffffff;
      RVar4 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar4 = pRVar2->item[(int)uVar1].ref;
        uVar5 = (ulong)uVar1;
      }
    }
  }
  while( true ) {
    if ((int)uVar5 == -1) {
      return 5;
    }
    if ((ref_geom->descr[RVar4 * 6] == type) && (ref_geom->descr[(int)(RVar4 * 6 | 1)] == id))
    break;
    pRVar3 = ref_geom->ref_adj->item;
    uVar5 = (ulong)pRVar3[(int)uVar5].next;
    RVar4 = -1;
    if (uVar5 != 0xffffffffffffffff) {
      RVar4 = pRVar3[uVar5].ref;
    }
  }
  *found = RVar4;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_find(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_INT id, REF_INT *found) {
  REF_INT item, geom;
  *found = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom) &&
        id == ref_geom_id(ref_geom, geom)) {
      *found = geom;
      return REF_SUCCESS;
    }
  }
  return REF_NOT_FOUND;
}